

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::WebSocket::ProtocolError>::~ArrayBuilder
          (ArrayBuilder<kj::WebSocket::ProtocolError> *this)

{
  ProtocolError *pPVar1;
  RemoveConst<kj::WebSocket::ProtocolError> *pRVar2;
  ProtocolError *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (ProtocolError *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->ptr = (ProtocolError *)0x0;
    this->pos = (RemoveConst<kj::WebSocket::ProtocolError> *)0x0;
    this->endPtr = (ProtocolError *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,0x18,((long)pRVar2 - (long)pPVar1 >> 3) * -0x5555555555555555,
               ((long)pPVar3 - (long)pPVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }